

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O3

ListSegment *
duckdb::CreateListSegment(ListSegmentFunctions *param_1,ArenaAllocator *allocator,uint16_t capacity)

{
  undefined8 *puVar1;
  long lVar2;
  ListSegment *pLVar3;
  undefined2 in_register_00000012;
  
  lVar2 = (ulong)CONCAT22(in_register_00000012,capacity) * 9;
  pLVar3 = (ListSegment *)
           ArenaAllocator::Allocate(allocator,(ulong)((int)lVar2 + 0x2fU & 0xfffffff8));
  pLVar3->capacity = capacity;
  pLVar3->count = 0;
  pLVar3->next = (ListSegment *)0x0;
  *(undefined8 *)((long)&pLVar3[2].count + lVar2) = 0;
  puVar1 = (undefined8 *)((long)&pLVar3[1].count + lVar2);
  *puVar1 = 0;
  puVar1[1] = 0;
  return pLVar3;
}

Assistant:

static ListSegment *CreateListSegment(const ListSegmentFunctions &, ArenaAllocator &allocator, uint16_t capacity) {
	// allocate data and set the header
	auto segment = reinterpret_cast<ListSegment *>(AllocateListData(allocator, capacity));
	segment->capacity = capacity;
	segment->count = 0;
	segment->next = nullptr;

	// create an empty linked list for the child vector
	auto linked_child_list = GetListChildData(segment);
	LinkedList linked_list(0, nullptr, nullptr);
	Store<LinkedList>(linked_list, data_ptr_cast(linked_child_list));

	return segment;
}